

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annotator.cpp
# Opt level: O2

void __thiscall
Annotator_automaticIdAllItemsWrongModel_Test::TestBody
          (Annotator_automaticIdAllItemsWrongModel_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_140 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  AssertionResult gtest_ar;
  ModelPtr model;
  AnnotatorPtr annotator;
  UnitsItemPtr itemUnitsItem;
  ResetPtr itemTestValue;
  ResetPtr itemResetValue;
  UnitsPtr itemUnits;
  VariablePtr itemVariable;
  VariablePairPtr itemMapVariables;
  ResetPtr itemReset;
  ModelPtr model2;
  ImportSourcePtr itemImportSource;
  VariablePairPtr itemConnection;
  ComponentPtr itemComponentEncapsulation;
  ComponentPtr itemComponent;
  ParserPtr parser;
  
  libcellml::Parser::create(SUB81(&parser,0));
  libcellml::Parser::parseModel((string *)&model);
  libcellml::Annotator::create();
  libcellml::ComponentEntity::component((ulong)&itemComponent);
  bVar1 = (bool)model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_1_;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_138,"component2",(allocator<char> *)&itemReset);
  libcellml::ComponentEntity::component((string *)&itemComponentEncapsulation,bVar1);
  std::__cxx11::string::~string((string *)&local_138);
  bVar1 = (bool)model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_1_;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_138,"component2",(allocator<char> *)&itemUnits);
  libcellml::ComponentEntity::component((string *)&itemResetValue,bVar1);
  libcellml::Component::variable((ulong)&itemMapVariables);
  libcellml::Variable::equivalentVariable((ulong)&itemImportSource);
  bVar1 = (bool)model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_1_;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&itemReset,"component2",(allocator<char> *)&itemVariable);
  libcellml::ComponentEntity::component((string *)&itemUnitsItem,bVar1);
  libcellml::Component::variable((ulong)&itemTestValue);
  libcellml::VariablePair::create((shared_ptr *)&itemConnection,(shared_ptr *)&itemImportSource);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&itemTestValue.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&itemUnitsItem.super___shared_ptr<libcellml::UnitsItem,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__cxx11::string::~string((string *)&itemReset);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&itemImportSource.
              super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&itemMapVariables.
              super___shared_ptr<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&itemResetValue.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__cxx11::string::~string((string *)&local_138);
  bVar1 = (bool)model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_1_;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_138,"component1",(allocator<char> *)&itemMapVariables);
  libcellml::ComponentEntity::component((string *)&itemReset,bVar1);
  libcellml::ImportedEntity::importSource();
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&itemReset.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  std::__cxx11::string::~string((string *)&local_138);
  bVar1 = (bool)model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_1_;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_138,"component2",(allocator<char> *)&model2);
  libcellml::ComponentEntity::component((string *)&itemTestValue,bVar1);
  libcellml::Component::variable((ulong)&itemResetValue);
  bVar1 = (bool)model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_1_;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&itemReset,"component2",(allocator<char> *)&gtest_ar);
  libcellml::ComponentEntity::component((string *)&itemVariable,bVar1);
  libcellml::Component::variable((ulong)&itemUnits);
  libcellml::Variable::equivalentVariable((ulong)&itemUnitsItem);
  libcellml::VariablePair::create((shared_ptr *)&itemMapVariables,(shared_ptr *)&itemResetValue);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&itemUnitsItem.super___shared_ptr<libcellml::UnitsItem,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&itemUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&itemVariable.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__cxx11::string::~string((string *)&itemReset);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&itemResetValue.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&itemTestValue.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__cxx11::string::~string((string *)&local_138);
  bVar1 = (bool)model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_1_;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_138,"component2",(allocator<char> *)&itemTestValue);
  libcellml::ComponentEntity::component((string *)&itemResetValue,bVar1);
  libcellml::Component::reset((ulong)&itemReset);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&itemResetValue.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__cxx11::string::~string((string *)&local_138);
  bVar1 = (bool)model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_1_;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_138,"component2",(allocator<char> *)&itemUnitsItem);
  libcellml::ComponentEntity::component((string *)&itemTestValue,bVar1);
  libcellml::Component::reset((ulong)&itemResetValue);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&itemTestValue.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__cxx11::string::~string((string *)&local_138);
  bVar1 = (bool)model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_1_;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_138,"component2",(allocator<char> *)&itemUnits);
  libcellml::ComponentEntity::component((string *)&itemUnitsItem,bVar1);
  libcellml::Component::reset((ulong)&itemTestValue);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&itemUnitsItem.super___shared_ptr<libcellml::UnitsItem,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__cxx11::string::~string((string *)&local_138);
  libcellml::Model::units((ulong)&local_138);
  libcellml::UnitsItem::create((shared_ptr *)&itemUnitsItem,(ulong)&local_138);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_138._M_string_length);
  libcellml::Model::units((ulong)&itemUnits);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_138,"component2",(allocator<char> *)&gtest_ar);
  libcellml::ComponentEntity::component
            ((string *)&model2,
             (bool)model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr.
                   _0_1_);
  libcellml::Component::variable((ulong)&itemVariable);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&model2.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__cxx11::string::~string((string *)&local_138);
  libcellml::Model::create();
  libcellml::Annotator::setModel
            ((shared_ptr *)
             annotator.super___shared_ptr<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::Annotator::assignId_abi_cxx11_
            ((shared_ptr *)&local_138,
             (CellmlElementType)
             annotator.super___shared_ptr<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  pcVar2 = "";
  testing::internal::CmpHelperEQ<char[1],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"\"","annotator->assignId(itemComponent)",
             (char (*) [1])0x153c1a,&local_138);
  std::__cxx11::string::~string((string *)&local_138);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_138);
    if (gtest_ar.message_.ptr_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_140,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x5d8,pcVar2);
    testing::internal::AssertHelper::operator=(local_140,(Message *)&local_138);
    testing::internal::AssertHelper::~AssertHelper(local_140);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_138);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  libcellml::Annotator::assignId_abi_cxx11_
            ((shared_ptr *)&local_138,
             (CellmlElementType)
             annotator.super___shared_ptr<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  pcVar2 = "";
  testing::internal::CmpHelperEQ<char[1],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"\"","annotator->assignId(itemComponentEncapsulation)",
             (char (*) [1])0x153c1a,&local_138);
  std::__cxx11::string::~string((string *)&local_138);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_138);
    if (gtest_ar.message_.ptr_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_140,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x5d9,pcVar2);
    testing::internal::AssertHelper::operator=(local_140,(Message *)&local_138);
    testing::internal::AssertHelper::~AssertHelper(local_140);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_138);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  libcellml::Annotator::assignId_abi_cxx11_
            ((shared_ptr *)&local_138,
             (CellmlElementType)
             annotator.super___shared_ptr<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  pcVar2 = "";
  testing::internal::CmpHelperEQ<char[1],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"\"","annotator->assignId(itemConnection)",
             (char (*) [1])0x153c1a,&local_138);
  std::__cxx11::string::~string((string *)&local_138);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_138);
    if (gtest_ar.message_.ptr_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_140,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x5da,pcVar2);
    testing::internal::AssertHelper::operator=(local_140,(Message *)&local_138);
    testing::internal::AssertHelper::~AssertHelper(local_140);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_138);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  libcellml::Annotator::assignId_abi_cxx11_
            ((shared_ptr *)&local_138,
             (CellmlElementType)
             annotator.super___shared_ptr<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  pcVar2 = "";
  testing::internal::CmpHelperEQ<char[1],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"\"","annotator->assignId(itemEncapsulation)",
             (char (*) [1])0x153c1a,&local_138);
  std::__cxx11::string::~string((string *)&local_138);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_138);
    if (gtest_ar.message_.ptr_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_140,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x5db,pcVar2);
    testing::internal::AssertHelper::operator=(local_140,(Message *)&local_138);
    testing::internal::AssertHelper::~AssertHelper(local_140);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_138);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  libcellml::Annotator::assignId_abi_cxx11_
            ((shared_ptr *)&local_138,
             (CellmlElementType)
             annotator.super___shared_ptr<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  pcVar2 = "";
  testing::internal::CmpHelperEQ<char[1],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"\"","annotator->assignId(itemMapVariables)",
             (char (*) [1])0x153c1a,&local_138);
  std::__cxx11::string::~string((string *)&local_138);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_138);
    if (gtest_ar.message_.ptr_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_140,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x5dc,pcVar2);
    testing::internal::AssertHelper::operator=(local_140,(Message *)&local_138);
    testing::internal::AssertHelper::~AssertHelper(local_140);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_138);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  libcellml::Annotator::assignId_abi_cxx11_
            ((shared_ptr *)&local_138,
             (CellmlElementType)
             annotator.super___shared_ptr<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  pcVar2 = "";
  testing::internal::CmpHelperEQ<char[1],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"\"","annotator->assignId(itemModel)",(char (*) [1])0x153c1a,
             &local_138);
  std::__cxx11::string::~string((string *)&local_138);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_138);
    if (gtest_ar.message_.ptr_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_140,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x5dd,pcVar2);
    testing::internal::AssertHelper::operator=(local_140,(Message *)&local_138);
    testing::internal::AssertHelper::~AssertHelper(local_140);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_138);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  libcellml::Annotator::assignId_abi_cxx11_
            ((shared_ptr *)&local_138,
             (CellmlElementType)
             annotator.super___shared_ptr<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  pcVar2 = "";
  testing::internal::CmpHelperEQ<char[1],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"\"","annotator->assignId(itemReset)",(char (*) [1])0x153c1a,
             &local_138);
  std::__cxx11::string::~string((string *)&local_138);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_138);
    if (gtest_ar.message_.ptr_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_140,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x5de,pcVar2);
    testing::internal::AssertHelper::operator=(local_140,(Message *)&local_138);
    testing::internal::AssertHelper::~AssertHelper(local_140);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_138);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  libcellml::Annotator::assignId_abi_cxx11_
            ((shared_ptr *)&local_138,
             (CellmlElementType)
             annotator.super___shared_ptr<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  pcVar2 = "";
  testing::internal::CmpHelperEQ<char[1],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"\"","annotator->assignId(itemResetValue)",
             (char (*) [1])0x153c1a,&local_138);
  std::__cxx11::string::~string((string *)&local_138);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_138);
    if (gtest_ar.message_.ptr_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_140,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x5df,pcVar2);
    testing::internal::AssertHelper::operator=(local_140,(Message *)&local_138);
    testing::internal::AssertHelper::~AssertHelper(local_140);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_138);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  libcellml::Annotator::assignId_abi_cxx11_
            ((shared_ptr *)&local_138,
             (CellmlElementType)
             annotator.super___shared_ptr<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  pcVar2 = "";
  testing::internal::CmpHelperEQ<char[1],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"\"","annotator->assignId(itemTestValue)",
             (char (*) [1])0x153c1a,&local_138);
  std::__cxx11::string::~string((string *)&local_138);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_138);
    if (gtest_ar.message_.ptr_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_140,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x5e0,pcVar2);
    testing::internal::AssertHelper::operator=(local_140,(Message *)&local_138);
    testing::internal::AssertHelper::~AssertHelper(local_140);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_138);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  libcellml::Annotator::assignId_abi_cxx11_((shared_ptr *)&local_138);
  pcVar2 = "";
  testing::internal::CmpHelperEQ<char[1],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"\"","annotator->assignId(itemUnitsItem)",
             (char (*) [1])0x153c1a,&local_138);
  std::__cxx11::string::~string((string *)&local_138);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_138);
    if (gtest_ar.message_.ptr_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_140,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x5e1,pcVar2);
    testing::internal::AssertHelper::operator=(local_140,(Message *)&local_138);
    testing::internal::AssertHelper::~AssertHelper(local_140);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_138);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  libcellml::Annotator::assignId_abi_cxx11_((shared_ptr *)&local_138);
  pcVar2 = "";
  testing::internal::CmpHelperEQ<char[1],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"\"","annotator->assignId(itemUnits)",(char (*) [1])0x153c1a,
             &local_138);
  std::__cxx11::string::~string((string *)&local_138);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_138);
    if (gtest_ar.message_.ptr_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_140,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x5e2,pcVar2);
    testing::internal::AssertHelper::operator=(local_140,(Message *)&local_138);
    testing::internal::AssertHelper::~AssertHelper(local_140);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_138);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  libcellml::Annotator::assignId_abi_cxx11_((shared_ptr *)&local_138);
  pcVar2 = "";
  testing::internal::CmpHelperEQ<char[1],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"\"","annotator->assignId(itemVariable)",(char (*) [1])0x153c1a
             ,&local_138);
  std::__cxx11::string::~string((string *)&local_138);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_138);
    if (gtest_ar.message_.ptr_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_140,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x5e3,pcVar2);
    testing::internal::AssertHelper::operator=(local_140,(Message *)&local_138);
    testing::internal::AssertHelper::~AssertHelper(local_140);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_138);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  libcellml::Annotator::assignId_abi_cxx11_((shared_ptr *)&local_138);
  testing::internal::CmpHelperEQ<char[7],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"b4da55\"","annotator->assignId(itemImportSource)",
             (char (*) [7])"b4da55",&local_138);
  std::__cxx11::string::~string((string *)&local_138);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_138);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_140,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x5e6,pcVar2);
    testing::internal::AssertHelper::operator=(local_140,(Message *)&local_138);
    testing::internal::AssertHelper::~AssertHelper(local_140);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_138);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&model2.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&itemVariable.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&itemUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&itemUnitsItem.super___shared_ptr<libcellml::UnitsItem,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&itemTestValue.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&itemResetValue.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&itemReset.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&itemMapVariables.
              super___shared_ptr<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&itemImportSource.
              super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&itemConnection.super___shared_ptr<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&itemComponentEncapsulation.
              super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&itemComponent.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&annotator.super___shared_ptr<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&parser.super___shared_ptr<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

TEST(Annotator, automaticIdAllItemsWrongModel)
{
    auto parser = libcellml::Parser::create();
    auto model = parser->parseModel(modelStringUniqueIds);
    auto annotator = libcellml::Annotator::create();

    auto itemComponent = model->component(0);
    auto itemComponentEncapsulation = model->component("component2");
    auto itemConnection = libcellml::VariablePair::create(
        model->component("component2")->variable(0)->equivalentVariable(0),
        model->component("component2")->variable(0));
    auto const &itemEncapsulation = model;
    auto itemImportSource = model->component("component1")->importSource();
    auto itemMapVariables = libcellml::VariablePair::create(
        model->component("component2")->variable(1),
        model->component("component2")->variable(1)->equivalentVariable(0));
    auto const &itemModel = model;
    auto itemReset = model->component("component2")->reset(0);
    auto itemResetValue = model->component("component2")->reset(0);
    auto itemTestValue = model->component("component2")->reset(0);
    auto itemUnitsItem = libcellml::UnitsItem::create(model->units(1), 0);
    auto itemUnits = model->units(1);
    auto itemVariable = model->component("component2")->variable(0);

    // Make a different model and build the annotator around that.
    auto model2 = libcellml::Model::create();
    annotator->setModel(model2);

    // Expect each have no change, since they are in a different model.
    EXPECT_EQ("", annotator->assignId(itemComponent));
    EXPECT_EQ("", annotator->assignId(itemComponentEncapsulation));
    EXPECT_EQ("", annotator->assignId(itemConnection));
    EXPECT_EQ("", annotator->assignId(itemEncapsulation));
    EXPECT_EQ("", annotator->assignId(itemMapVariables));
    EXPECT_EQ("", annotator->assignId(itemModel));
    EXPECT_EQ("", annotator->assignId(itemReset));
    EXPECT_EQ("", annotator->assignId(itemResetValue));
    EXPECT_EQ("", annotator->assignId(itemTestValue));
    EXPECT_EQ("", annotator->assignId(itemUnitsItem));
    EXPECT_EQ("", annotator->assignId(itemUnits));
    EXPECT_EQ("", annotator->assignId(itemVariable));

    // Import sources don't belong to a model so an identifier will be assigned.
    EXPECT_EQ("b4da55", annotator->assignId(itemImportSource));
}